

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printArithExtend(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  ulong uVar6;
  char *s;
  uint uVar7;
  byte bVar8;
  uint val;
  byte bVar9;
  
  pMVar5 = MCInst_getOperand(MI,OpNum);
  uVar6 = MCOperand_getImm(pMVar5);
  switch((uint)(uVar6 >> 3) & 7) {
  case 0:
    uVar7 = 5;
    break;
  case 1:
    uVar7 = 6;
    break;
  case 2:
    uVar7 = 7;
    bVar8 = 1;
    goto LAB_0018961b;
  case 3:
    uVar7 = 8;
    bVar9 = 1;
    bVar8 = 0;
    goto LAB_0018961e;
  case 4:
    uVar7 = 9;
    break;
  case 5:
    uVar7 = 10;
    break;
  case 6:
    uVar7 = 0xb;
    break;
  case 7:
    uVar7 = 0xc;
  }
  bVar8 = 0;
LAB_0018961b:
  bVar9 = 0;
LAB_0018961e:
  val = (uint)uVar6 & 7;
  if (uVar7 - 7 < 2) {
    pMVar5 = MCInst_getOperand(MI,0);
    uVar3 = MCOperand_getReg(pMVar5);
    pMVar5 = MCInst_getOperand(MI,1);
    uVar4 = MCOperand_getReg(pMVar5);
    if (((bool)(bVar9 & (uVar4 == 4 || uVar3 == 4))) || ((bool)(bVar8 & (uVar4 == 5 || uVar3 == 5)))
       ) {
      if ((uVar6 & 7) == 0) {
        return;
      }
      s = ", lsl ";
      goto LAB_001896f6;
    }
  }
  SStream_concat(O,", %s",&DAT_001e5dc8 + *(int *)(&DAT_001e5db4 + (ulong)uVar7 * 4));
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->regs_write + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0xf;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  if ((uVar6 & 7) == 0) {
    return;
  }
  s = " ";
LAB_001896f6:
  SStream_concat0(O,s);
  printInt32Bang(O,val);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->regs_write + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 7;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->regs_write + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0xb) =
         val;
  }
  return;
}

Assistant:

static void printArithExtend(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	AArch64_AM_ShiftExtendType ExtType = AArch64_AM_getArithExtendType(Val);
	unsigned ShiftVal = AArch64_AM_getArithShiftValue(Val);

	// If the destination or first source register operand is [W]SP, print
	// UXTW/UXTX as LSL, and if the shift amount is also zero, print nothing at
	// all.
	if (ExtType == AArch64_AM_UXTW || ExtType == AArch64_AM_UXTX) {
		unsigned Dest = MCOperand_getReg(MCInst_getOperand(MI, 0));
		unsigned Src1 = MCOperand_getReg(MCInst_getOperand(MI, 1));
		if ( ((Dest == AArch64_SP || Src1 == AArch64_SP) &&
					ExtType == AArch64_AM_UXTX) ||
				((Dest == AArch64_WSP || Src1 == AArch64_WSP) &&
				 ExtType == AArch64_AM_UXTW) ) {
			if (ShiftVal != 0) {
				SStream_concat0(O, ", lsl ");
				printInt32Bang(O, ShiftVal);
				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
				}
			}

			return;
		}
	}

	SStream_concat(O, ", %s", AArch64_AM_getShiftExtendName(ExtType));
	if (MI->csh->detail) {
		arm64_extender ext = ARM64_EXT_INVALID;
		switch(ExtType) {
			default:	// never reach
			case AArch64_AM_UXTB:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTH:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTX:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTB:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTH:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTX:
				ext = ARM64_EXT_UXTW;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].ext = ext;
	}

	if (ShiftVal != 0) {
		SStream_concat0(O, " ");
		printInt32Bang(O, ShiftVal);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
		}
	}
}